

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

int16_t WebRtcIsac_EncodeJitterInfo(int32_t jitterIndex,Bitstr *streamData)

{
  int32_t local_1c;
  Bitstr *pBStack_18;
  int intVar;
  Bitstr *streamData_local;
  int32_t jitterIndex_local;
  
  if ((jitterIndex < 0) || (1 < jitterIndex)) {
    streamData_local._6_2_ = -1;
  }
  else {
    local_1c = jitterIndex;
    pBStack_18 = streamData;
    streamData_local._0_4_ = jitterIndex;
    WebRtcIsac_EncHistMulti(streamData,&local_1c,kOneBitEqualProbCdf_ptr,1);
    streamData_local._6_2_ = 0;
  }
  return streamData_local._6_2_;
}

Assistant:

int16_t WebRtcIsac_EncodeJitterInfo(int32_t jitterIndex,
                                    Bitstr* streamData) {
  /* This is to avoid LINUX warning until we change 'int' to 'Word32'. */
  int intVar;

  if ((jitterIndex < 0) || (jitterIndex > 1)) {
    return -1;
  }
  intVar = (int)(jitterIndex);
  /* Use the same CDF table as for bandwidth
   * both take two values with equal probability.*/
  WebRtcIsac_EncHistMulti(streamData, &intVar, kOneBitEqualProbCdf_ptr, 1);
  return 0;
}